

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O2

bool absl::lts_20250127::log_internal::Encode32Bit(uint64_t tag,uint32_t value,Span<char> *buf)

{
  uint64_t value_00;
  size_type n;
  size_t size;
  reference pcVar1;
  ulong uVar2;
  size_t s;
  size_type i;
  
  uVar2 = (ulong)value;
  value_00 = tag * 8 + 5;
  size = VarintSize(value_00);
  n = buf->len_;
  if (n < size + 4) {
    Span<char>::remove_suffix(buf,n);
  }
  else {
    anon_unknown_4::EncodeRawVarint(value_00,size,buf);
    for (i = 0; i != 4; i = i + 1) {
      pcVar1 = Span<char>::operator[](buf,i);
      *pcVar1 = (char)uVar2;
      uVar2 = uVar2 >> 8;
    }
    Span<char>::remove_prefix(buf,4);
  }
  return size + 4 <= n;
}

Assistant:

bool Encode32Bit(uint64_t tag, uint32_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::k32Bit);
  const size_t tag_type_size = VarintSize(tag_type);
  if (tag_type_size + sizeof(value) > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  for (size_t s = 0; s < sizeof(value); s++) {
    (*buf)[s] = static_cast<char>(value & 0xff);
    value >>= 8;
  }
  buf->remove_prefix(sizeof(value));
  return true;
}